

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_hv_accept.cpp
# Opt level: O0

int __thiscall
ir_assignment::accept(ir_assignment *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  long *plVar1;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_24;
  ir_visitor_status s;
  ir_hierarchical_visitor *v_local;
  ir_assignment *this_local;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,__fd);
  local_34 = (**(code **)(*plVar1 + 0xc0))();
  if (local_34 == 0) {
    *(undefined1 *)(plVar1 + 6) = 1;
    local_38 = (*(this->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[3])
                         (this->lhs,plVar1);
    *(undefined1 *)(plVar1 + 6) = 0;
    if (local_38 == 0) {
      local_3c = (*(this->rhs->super_ir_instruction)._vptr_ir_instruction[3])(this->rhs,plVar1);
      if (local_3c == 0) {
        local_24 = local_3c;
        if (this->condition != (ir_rvalue *)0x0) {
          local_24 = (*(this->condition->super_ir_instruction)._vptr_ir_instruction[3])
                               (this->condition,plVar1);
        }
        if (local_24 == 2) {
          local_40 = local_24;
        }
        else {
          local_40 = (**(code **)(*plVar1 + 200))(plVar1,this);
        }
        this_local._4_4_ = local_40;
      }
      else {
        if (local_3c == 1) {
          local_3c = 0;
        }
        this_local._4_4_ = local_3c;
      }
    }
    else {
      if (local_38 == 1) {
        local_38 = 0;
      }
      this_local._4_4_ = local_38;
    }
  }
  else {
    if (local_34 == 1) {
      local_34 = 0;
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
ir_assignment::accept(ir_hierarchical_visitor *v)
{
   ir_visitor_status s = v->visit_enter(this);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   v->in_assignee = true;
   s = this->lhs->accept(v);
   v->in_assignee = false;
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   s = this->rhs->accept(v);
   if (s != visit_continue)
      return (s == visit_continue_with_parent) ? visit_continue : s;

   if (this->condition)
      s = this->condition->accept(v);

   return (s == visit_stop) ? s : v->visit_leave(this);
}